

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib579.c
# Opt level: O2

size_t read_callback(void *ptr,size_t size,size_t nmemb,void *userp)

{
  char *__s;
  size_t __n;
  
  if ((size * nmemb == 0) || ((long)*userp == 4)) {
    __n = 0;
  }
  else {
    __s = post[*userp];
    __n = strlen(__s);
    memcpy(ptr,__s,__n);
    *(int *)userp = *userp + 1;
  }
  return __n;
}

Assistant:

static size_t read_callback(void *ptr, size_t size, size_t nmemb, void *userp)
{
  struct WriteThis *pooh = (struct WriteThis *)userp;
  const char *data;

  if(size*nmemb < 1)
    return 0;

  data = post[pooh->counter];

  if(data) {
    size_t len = strlen(data);
    memcpy(ptr, data, len);
    pooh->counter++; /* advance pointer */
    return len;
  }
  return 0;                         /* no more data left to deliver */
}